

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O0

SPxId __thiscall
soplex::
SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnter(SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this)

{
  long *plVar1;
  bool bVar2;
  Verbosity VVar3;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *x;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_01;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *delta;
  Verbosity old_verbosity;
  SPxId enterId;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_000005e0;
  SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_000005e8;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffffcf8;
  cpp_dec_float<200U,_int,_void> *in_stack_fffffffffffffd00;
  SPxId *in_stack_fffffffffffffd18;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffd20;
  int local_264;
  undefined1 local_260 [120];
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffe18;
  undefined8 local_1d8;
  undefined1 local_1d0 [128];
  DataKey in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  Verbosity in_stack_fffffffffffffebc;
  undefined1 local_140 [128];
  DataKey local_c0;
  DataKey local_b0;
  SPxId **local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  uint *local_90;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_81;
  undefined8 *local_80;
  SPxId **local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  SPxId **local_60;
  undefined1 *local_58;
  undefined8 *local_50;
  long local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  int *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  int *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  SPxId::SPxId((SPxId *)0x770669);
  local_a8 = &(in_RDI->theBaseId).data;
  local_a0 = local_140;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  local_c0 = (DataKey)selectEnterX(in_stack_000005e8,in_stack_000005e0);
  local_b0 = local_c0;
  bVar2 = SPxId::isValid((SPxId *)&local_b0);
  if ((!bVar2) && (((in_RDI->lastFill).m_backend.data._M_elems[0x14] & 1) == 0)) {
    *(undefined1 *)((in_RDI->lastFill).m_backend.data._M_elems + 0x14) = 1;
    if ((*(long *)(*(long *)&in_RDI->theBaseId + 0x14b0) != 0) &&
       (VVar3 = SPxOut::getVerbosity(*(SPxOut **)(*(long *)&in_RDI->theBaseId + 0x14b0)),
       4 < (int)VVar3)) {
      in_stack_fffffffffffffebc =
           SPxOut::getVerbosity(*(SPxOut **)(*(long *)&in_RDI->theBaseId + 0x14b0));
      plVar1 = *(long **)(*(long *)&in_RDI->theBaseId + 0x14b0);
      in_stack_fffffffffffffeb8 = 5;
      (**(code **)(*plVar1 + 0x10))(plVar1,&stack0xfffffffffffffeb8);
      soplex::operator<<((SPxOut *)in_stack_fffffffffffffd00,(char *)in_stack_fffffffffffffcf8);
      plVar1 = *(long **)(*(long *)&in_RDI->theBaseId + 0x14b0);
      (**(code **)(*plVar1 + 0x10))(plVar1,&stack0xfffffffffffffebc);
    }
    local_78 = &(in_RDI->theBaseId).data;
    local_1d8 = 0x4000000000000000;
    local_70 = local_1d0;
    local_80 = &local_1d8;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_81,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_78);
    local_68 = local_1d0;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              (in_stack_fffffffffffffd00);
    local_58 = local_1d0;
    local_60 = local_78;
    local_50 = local_80;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,(double *)0x770876);
    in_stack_fffffffffffffeb0 = (DataKey)selectEnterX(in_stack_000005e8,in_stack_000005e0);
    local_b0 = in_stack_fffffffffffffeb0;
  }
  bVar2 = SPxId::isValid((SPxId *)&local_b0);
  if (bVar2) {
    this_00 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::fVec(*(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       **)&in_RDI->theBaseId);
    x = UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::delta(this_00);
    this_01 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::basis(*(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        **)&in_RDI->theBaseId);
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::vector(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::solve4update(in_RDI,x,(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)this_01);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::
    setup_and_assign<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              ((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
               (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_fffffffffffffeb0);
    local_264 = 1;
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::length2(in_stack_fffffffffffffe18);
    local_28 = local_260;
    local_30 = &local_264;
    local_38 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&stack0xfffffffffffffd1c;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_39,local_38);
    local_20 = local_260;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<200U,_int,_void> *)this_01);
    local_8 = local_260;
    local_10 = local_38;
    local_18 = local_30;
    local_48 = (long)*local_30;
    boost::multiprecision::default_ops::
    eval_add<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,long_long>
              ((cpp_dec_float<200U,_int,_void> *)this_01,in_stack_fffffffffffffcf8,
               (longlong *)0x770a17);
    local_90 = (in_RDI->memFactor).m_backend.data._M_elems + 0x1a;
    local_98 = local_260;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
              ((cpp_dec_float<200U,_int,_void> *)this_01,in_stack_fffffffffffffcf8);
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::setup4coSolve(*(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      **)&in_RDI->theBaseId,
                    (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((in_RDI->nonzeroFactor).m_backend.data._M_elems + 0x16),
                    (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((in_RDI->fillFactor).m_backend.data._M_elems + 10));
  }
  return (SPxId)local_b0;
}

Assistant:

SPxId SPxSteepPR<R>::selectEnter()
{
   assert(this->thesolver != nullptr);
   SPxId enterId;

   enterId = selectEnterX(this->thetolerance);

   if(!enterId.isValid() && !refined)
   {
      refined = true;
      SPX_MSG_INFO3((*this->thesolver->spxout),
                    (*this->thesolver->spxout) << "WSTEEP05 trying refinement step..\n";)
      enterId = selectEnterX(this->thetolerance / SOPLEX_STEEP_REFINETOL);
   }

   assert(isConsistent());

   if(enterId.isValid())
   {
      SSVectorBase<R>& delta = this->thesolver->fVec().delta();

      this->thesolver->basis().solve4update(delta, this->thesolver->vector(enterId));

      workRhs.setup_and_assign(delta);
      pi_p = 1 + delta.length2();

      this->thesolver->setup4coSolve(&workVec, &workRhs);
   }

   return enterId;
}